

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * __thiscall
google::protobuf::FileDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FileDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  size_t sVar5;
  size_type sVar6;
  FileDescriptor *pFVar7;
  size_type sVar8;
  int i_1;
  long lVar9;
  int i_4;
  int i;
  long lVar10;
  long lVar11;
  int i_2;
  long lVar12;
  SubstituteArg local_3c8;
  vector<int,_std::allocator<int>_> path;
  SubstituteArg local_360;
  SubstituteArg local_330;
  SubstituteArg local_300;
  SubstituteArg local_2d0;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  vector<int,_std::allocator<int>_> path_1;
  set<int,_std::less<int>,_std::allocator<int>_> public_dependencies;
  set<int,_std::less<int>,_std::allocator<int>_> weak_dependencies;
  SourceLocationCommentPrinter comment_printer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  comment_printer.have_source_loc_ = true;
  comment_printer._1_3_ = 0;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&path,(int *)&comment_printer);
  std::__cxx11::string::string
            ((string *)&groups,anon_var_dwarf_37602c + 0x11,(allocator *)&public_dependencies);
  anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
            (&comment_printer,this,&path,(string *)&groups,debug_string_options);
  std::__cxx11::string::~string((string *)&groups);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  groups._M_t._M_impl._0_8_ = SyntaxName(*(Syntax *)(this + 0x3c));
  sVar5 = strlen((char *)groups._M_t._M_impl._0_8_);
  public_dependencies._M_t._M_impl._0_8_ = 0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  weak_dependencies._M_t._M_impl._0_8_ = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = ~_S_red;
  local_3c8.text_ = (char *)0x0;
  local_3c8.size_ = -1;
  local_270.text_ = (char *)0x0;
  local_270.size_ = -1;
  local_240.text_ = (char *)0x0;
  local_240.size_ = -1;
  local_210.text_ = (char *)0x0;
  local_210.size_ = -1;
  local_300.text_ = (char *)0x0;
  local_300.size_ = -1;
  local_330.text_ = (char *)0x0;
  local_330.size_ = -1;
  local_360.text_ = (char *)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)sVar5;
  local_360.size_ = -1;
  strings::SubstituteAndAppend
            (__return_storage_ptr__,"syntax = \"$0\";\n\n",(SubstituteArg *)&groups,
             (SubstituteArg *)&public_dependencies,(SubstituteArg *)&weak_dependencies,&local_3c8,
             &local_270,&local_240,&local_210,&local_300,&local_330,&local_360);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&path.super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::string
            ((string *)&groups,anon_var_dwarf_37602c + 0x11,(allocator *)&public_dependencies);
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&groups);
  if (debug_string_options->include_comments == true) {
    bVar2 = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    bVar2 = false;
  }
  comment_printer.have_source_loc_ = bVar2;
  std::__cxx11::string::~string((string *)&groups);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            (&comment_printer,__return_storage_ptr__);
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       public_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       weak_dependencies._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_range_unique<int*>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &public_dependencies,*(int **)(this + 0x58),
             *(int **)(this + 0x58) + *(int *)(this + 0x24));
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_range_unique<int*>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &weak_dependencies,*(int **)(this + 0x60),
             *(int **)(this + 0x60) + *(int *)(this + 0x28));
  iVar3 = 0;
  while (local_2a0.text_ = (char *)CONCAT44(local_2a0.text_._4_4_,iVar3),
        iVar3 < *(int *)(this + 0x20)) {
    sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                      (&public_dependencies,(key_type_conflict *)&local_2a0);
    if (sVar6 == 0) {
      sVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (&weak_dependencies,(key_type_conflict *)&local_2a0);
      if (sVar6 == 0) {
        pFVar7 = dependency(this,(int)local_2a0.text_);
        groups._M_t._M_impl._0_8_ = **(undefined8 **)pFVar7;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(*(undefined8 **)pFVar7 + 1);
        local_3c8.text_ = (char *)0x0;
        local_3c8.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_300.text_ = (char *)0x0;
        local_300.size_ = -1;
        local_330.text_ = (char *)0x0;
        local_330.size_ = -1;
        local_360.text_ = (char *)0x0;
        local_360.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_2d0.text_ = (char *)0x0;
        local_2d0.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import \"$0\";\n",(SubstituteArg *)&groups,&local_3c8,
                   &local_270,&local_240,&local_210,&local_300,&local_330,&local_360,
                   (SubstituteArg *)&path,&local_2d0);
      }
      else {
        pFVar7 = dependency(this,(int)local_2a0.text_);
        groups._M_t._M_impl._0_8_ = **(undefined8 **)pFVar7;
        groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             *(_Rb_tree_color *)(*(undefined8 **)pFVar7 + 1);
        local_3c8.text_ = (char *)0x0;
        local_3c8.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_300.text_ = (char *)0x0;
        local_300.size_ = -1;
        local_330.text_ = (char *)0x0;
        local_330.size_ = -1;
        local_360.text_ = (char *)0x0;
        local_360.size_ = -1;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish._4_4_,0xffffffff);
        local_2d0.text_ = (char *)0x0;
        local_2d0.size_ = -1;
        strings::SubstituteAndAppend
                  (__return_storage_ptr__,"import weak \"$0\";\n",(SubstituteArg *)&groups,
                   &local_3c8,&local_270,&local_240,&local_210,&local_300,&local_330,&local_360,
                   (SubstituteArg *)&path,&local_2d0);
      }
    }
    else {
      pFVar7 = dependency(this,(int)local_2a0.text_);
      groups._M_t._M_impl._0_8_ = **(undefined8 **)pFVar7;
      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           *(_Rb_tree_color *)(*(undefined8 **)pFVar7 + 1);
      local_3c8.text_ = (char *)0x0;
      local_3c8.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_300.text_ = (char *)0x0;
      local_300.size_ = -1;
      local_330.text_ = (char *)0x0;
      local_330.size_ = -1;
      local_360.text_ = (char *)0x0;
      local_360.size_ = -1;
      path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,0xffffffff);
      local_2d0.text_ = (char *)0x0;
      local_2d0.size_ = -1;
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"import public \"$0\";\n",(SubstituteArg *)&groups,
                 &local_3c8,&local_270,&local_240,&local_210,&local_300,&local_330,&local_360,
                 (SubstituteArg *)&path,&local_2d0);
    }
    iVar3 = (int)local_2a0.text_ + 1;
  }
  if (*(long *)(*(long *)(this + 8) + 8) != 0) {
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    groups._M_t._M_impl._0_4_ = 2;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&path_1,(int *)&groups);
    std::__cxx11::string::string
              ((string *)&local_3c8,anon_var_dwarf_37602c + 0x11,(allocator *)&local_270);
    anon_unknown_1::SourceLocationCommentPrinter::SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)&groups,this,&path_1,(string *)&local_3c8,
               debug_string_options);
    std::__cxx11::string::~string((string *)&local_3c8);
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    local_3c8.text_ = (char *)**(undefined8 **)(this + 8);
    local_3c8.size_ = *(int *)(*(undefined8 **)(this + 8) + 1);
    local_270.text_ = (char *)0x0;
    local_270.size_ = -1;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    local_300.text_ = (char *)0x0;
    local_300.size_ = -1;
    local_330.text_ = (char *)0x0;
    local_330.size_ = -1;
    local_360.text_ = (char *)0x0;
    local_360.size_ = -1;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,0xffffffff);
    local_2d0.text_ = (char *)0x0;
    local_2d0.size_ = -1;
    local_2a0.text_ = (char *)0x0;
    local_2a0.size_ = -1;
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"package $0;\n\n",&local_3c8,&local_270,&local_240,&local_210,
               &local_300,&local_330,&local_360,(SubstituteArg *)&path,&local_2d0,&local_2a0);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
              ((SourceLocationCommentPrinter *)&groups,__return_storage_ptr__);
    anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter
              ((SourceLocationCommentPrinter *)&groups);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&path_1.super__Vector_base<int,_std::allocator<int>_>);
  }
  bVar2 = anon_unknown_1::FormatLineOptions
                    (0,*(Message **)(this + 0x88),*(DescriptorPool **)(this + 0x10),
                     __return_storage_ptr__);
  if (bVar2) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  lVar12 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(this + 0x30); lVar10 = lVar10 + 1) {
    EnumDescriptor::DebugString
              ((EnumDescriptor *)(*(long *)(this + 0x70) + lVar12),0,__return_storage_ptr__,
               debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar12 = lVar12 + 0x50;
  }
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &groups._M_t._M_impl.super__Rb_tree_header._M_header;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  lVar12 = 0;
  groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar10 = 0; lVar10 < *(int *)(this + 0x38); lVar10 = lVar10 + 1) {
    TVar4 = FieldDescriptor::type((FieldDescriptor *)(*(long *)(this + 0x80) + lVar12));
    if (TVar4 == TYPE_GROUP) {
      local_3c8.text_ =
           (char *)FieldDescriptor::message_type
                             ((FieldDescriptor *)(*(long *)(this + 0x80) + lVar12));
      std::
      _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
      ::_M_insert_unique<google::protobuf::Descriptor_const*>
                ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&groups,(Descriptor **)&local_3c8);
    }
    lVar12 = lVar12 + 0x98;
  }
  lVar10 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(this + 0x2c); lVar12 = lVar12 + 1) {
    local_3c8.text_ = (char *)(*(long *)(this + 0x68) + lVar10);
    sVar8 = std::
            set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
            ::count(&groups,(key_type *)&local_3c8);
    if (sVar8 == 0) {
      Descriptor::DebugString
                ((Descriptor *)(*(long *)(this + 0x68) + lVar10),0,__return_storage_ptr__,
                 debug_string_options,true);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    lVar10 = lVar10 + 0x90;
  }
  lVar12 = 0;
  for (lVar10 = 0; lVar10 < *(int *)(this + 0x34); lVar10 = lVar10 + 1) {
    ServiceDescriptor::DebugString
              ((ServiceDescriptor *)(*(long *)(this + 0x78) + lVar12),__return_storage_ptr__,
               debug_string_options);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    lVar12 = lVar12 + 0x30;
  }
  lVar11 = 0;
  lVar10 = 0;
  for (lVar12 = 0; lVar12 < *(int *)(this + 0x38); lVar12 = lVar12 + 1) {
    lVar9 = *(long *)(this + 0x80);
    lVar1 = *(long *)(lVar9 + 0x50 + lVar11);
    if (lVar1 != lVar10) {
      lVar10 = lVar1;
      if (lVar11 != 0) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        lVar10 = *(long *)(*(long *)(this + 0x80) + 0x50 + lVar11);
      }
      local_3c8.text_ = (char *)**(undefined8 **)(lVar10 + 8);
      local_3c8.size_ = *(int *)(*(undefined8 **)(lVar10 + 8) + 1);
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_300.text_ = (char *)0x0;
      local_300.size_ = -1;
      local_330.text_ = (char *)0x0;
      local_330.size_ = -1;
      local_360.text_ = (char *)0x0;
      local_360.size_ = -1;
      path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,0xffffffff);
      local_2d0.text_ = (char *)0x0;
      local_2d0.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      strings::SubstituteAndAppend
                (__return_storage_ptr__,"extend .$0 {\n",&local_3c8,&local_270,&local_240,&local_210
                 ,&local_300,&local_330,&local_360,(SubstituteArg *)&path,&local_2d0,&local_2a0);
      lVar9 = *(long *)(this + 0x80);
    }
    FieldDescriptor::DebugString
              ((FieldDescriptor *)(lVar9 + lVar11),1,PRINT_LABEL,__return_storage_ptr__,
               debug_string_options);
    lVar11 = lVar11 + 0x98;
  }
  if (0 < *(int *)(this + 0x38)) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment
            (&comment_printer,__return_storage_ptr__);
  std::
  _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~_Rb_tree(&groups._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&weak_dependencies._M_t);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&public_dependencies._M_t);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  return __return_storage_ptr__;
}

Assistant:

std::string FileDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kSyntaxFieldNumber);
    SourceLocationCommentPrinter syntax_comment(this, path, "",
                                                debug_string_options);
    syntax_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "syntax = \"$0\";\n\n",
                                 SyntaxName(syntax()));
    syntax_comment.AddPostComment(&contents);
  }

  SourceLocationCommentPrinter comment_printer(this, "", debug_string_options);
  comment_printer.AddPreComment(&contents);

  std::set<int> public_dependencies;
  std::set<int> weak_dependencies;
  public_dependencies.insert(public_dependencies_,
                             public_dependencies_ + public_dependency_count_);
  weak_dependencies.insert(weak_dependencies_,
                           weak_dependencies_ + weak_dependency_count_);

  for (int i = 0; i < dependency_count(); i++) {
    if (public_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import public \"$0\";\n",
                                   dependency(i)->name());
    } else if (weak_dependencies.count(i) > 0) {
      strings::SubstituteAndAppend(&contents, "import weak \"$0\";\n",
                                   dependency(i)->name());
    } else {
      strings::SubstituteAndAppend(&contents, "import \"$0\";\n",
                                   dependency(i)->name());
    }
  }

  if (!package().empty()) {
    std::vector<int> path;
    path.push_back(FileDescriptorProto::kPackageFieldNumber);
    SourceLocationCommentPrinter package_comment(this, path, "",
                                                 debug_string_options);
    package_comment.AddPreComment(&contents);
    strings::SubstituteAndAppend(&contents, "package $0;\n\n", package());
    package_comment.AddPostComment(&contents);
  }

  if (FormatLineOptions(0, options(), pool(), &contents)) {
    contents.append("\n");  // add some space if we had options
  }

  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(0, &contents, debug_string_options);
    contents.append("\n");
  }

  // Find all the 'group' type extensions; we will not output their nested
  // definitions (those will be done with their group field descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < message_type_count(); i++) {
    if (groups.count(message_type(i)) == 0) {
      message_type(i)->DebugString(0, &contents, debug_string_options,
                                   /* include_opening_clause */ true);
      contents.append("\n");
    }
  }

  for (int i = 0; i < service_count(); i++) {
    service(i)->DebugString(&contents, debug_string_options);
    contents.append("\n");
  }

  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) contents.append("}\n\n");
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                                   containing_type->full_name());
    }
    extension(i)->DebugString(1, FieldDescriptor::PRINT_LABEL, &contents,
                              debug_string_options);
  }
  if (extension_count() > 0) contents.append("}\n\n");

  comment_printer.AddPostComment(&contents);

  return contents;
}